

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm.cpp
# Opt level: O0

Ref<embree::Image> embree::loadPPM(FileName *fileName)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  runtime_error *prVar4;
  _func_int **pp_Var5;
  Image *in_RDI;
  ssize_t x_2;
  ssize_t y_2;
  unsigned_short rgb_1 [3];
  ssize_t x_1;
  ssize_t y_1;
  uchar rgb [3];
  ssize_t x;
  ssize_t y;
  int b;
  int g;
  int r;
  float rcpMaxColor;
  int maxColor;
  int height;
  int width;
  string type;
  char cty [2];
  fstream file;
  Ref<embree::Image> *img;
  FileName *in_stack_fffffffffffffb18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  size_t in_stack_fffffffffffffb58;
  size_t in_stack_fffffffffffffb60;
  ImageT<embree::Col4<unsigned_char>_> *in_stack_fffffffffffffb68;
  float local_408;
  float fStack_404;
  float fStack_400;
  undefined4 uStack_3fc;
  long local_3f0;
  long local_3e8;
  ushort local_3de;
  ushort local_3dc;
  ushort local_3da;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  undefined4 uStack_3cc;
  long local_3c0;
  long local_3b8;
  byte local_3ab;
  byte local_3aa;
  byte local_3a9;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  undefined4 uStack_39c;
  long local_390;
  long local_388;
  int local_380;
  int local_37c;
  int local_378;
  undefined1 local_371;
  string local_370 [35];
  undefined1 local_34d;
  float local_34c;
  int local_348;
  int local_344;
  int local_340;
  allocator local_339;
  string local_338 [34];
  char local_316 [14];
  long local_308 [68];
  _func_int **local_e8;
  undefined4 local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float *local_b0;
  undefined4 local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float *local_98;
  undefined4 local_90;
  float local_8c;
  float local_88;
  float local_84;
  float *local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float local_54;
  float local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float local_34;
  float local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_10;
  float local_c;
  float local_8;
  undefined4 local_4;
  
  std::fstream::fstream(local_308);
  uVar1 = *(undefined8 *)(local_308[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_308 + (int)uVar1);
  pcVar3 = FileName::c_str((FileName *)0x41d87e);
  std::operator|(_S_in,_S_bin);
  std::fstream::open((char *)local_308,(_Ios_Openmode)pcVar3);
  std::istream::read((char *)local_308,(long)local_316);
  skipSpacesAndComments((fstream *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,local_316,2,&local_339);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::istream::operator>>(local_308,&local_340);
  skipSpacesAndComments((fstream *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  std::istream::operator>>(local_308,&local_344);
  skipSpacesAndComments((fstream *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  std::istream::operator>>(local_308,&local_348);
  if (local_348 < 1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Invalid maxColor value in PPM file");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_34c = 1.0 / (float)local_348;
  std::istream::ignore();
  local_34d = 0;
  pp_Var5 = (_func_int **)::operator_new(0x48);
  local_371 = 1;
  FileName::operator_cast_to_string(in_stack_fffffffffffffb18);
  ImageT<embree::Col4<unsigned_char>_>::ImageT
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (string *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  local_371 = 0;
  (in_RDI->super_RefCount)._vptr_RefCount = pp_Var5;
  local_e8 = pp_Var5;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  std::__cxx11::string::~string(local_370);
  bVar2 = std::operator==(in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
  if (bVar2) {
    for (local_388 = 0; local_388 < local_344; local_388 = local_388 + 1) {
      for (local_390 = 0; local_390 < local_340; local_390 = local_390 + 1) {
        std::istream::operator>>(local_308,&local_378);
        std::istream::operator>>(local_308,&local_37c);
        std::istream::operator>>(local_308,&local_380);
        pp_Var5 = (in_RDI->super_RefCount)._vptr_RefCount;
        local_b4 = (float)local_378 * local_34c;
        local_b8 = (float)local_37c * local_34c;
        local_bc = (float)local_380 * local_34c;
        local_b0 = &local_3a8;
        local_c0 = 0x3f800000;
        local_4 = 0x3f800000;
        local_28 = CONCAT44(local_b8,local_b4);
        uStack_20 = CONCAT44(0x3f800000,local_bc);
        uStack_39c = 0x3f800000;
        local_10 = local_b4;
        local_c = local_b8;
        local_8 = local_bc;
        local_3a8 = local_b4;
        fStack_3a4 = local_b8;
        fStack_3a0 = local_bc;
        (**(code **)(*pp_Var5 + 0x28))(pp_Var5,local_390,local_388,&local_3a8);
      }
    }
  }
  else {
    bVar2 = std::operator==(in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
    if ((bVar2) && (local_348 < 0x100)) {
      for (local_3b8 = 0; local_3b8 < local_344; local_3b8 = local_3b8 + 1) {
        for (local_3c0 = 0; local_3c0 < local_340; local_3c0 = local_3c0 + 1) {
          std::istream::read((char *)local_308,(long)&local_3ab);
          pp_Var5 = (in_RDI->super_RefCount)._vptr_RefCount;
          local_9c = (float)local_3ab * local_34c;
          local_a0 = (float)local_3aa * local_34c;
          local_a4 = (float)local_3a9 * local_34c;
          local_98 = &local_3d8;
          local_a8 = 0x3f800000;
          local_2c = 0x3f800000;
          local_48 = CONCAT44(local_a0,local_9c);
          uStack_40 = CONCAT44(0x3f800000,local_a4);
          uStack_3cc = 0x3f800000;
          local_38 = local_9c;
          local_34 = local_a0;
          local_30 = local_a4;
          local_3d8 = local_9c;
          fStack_3d4 = local_a0;
          fStack_3d0 = local_a4;
          (**(code **)(*pp_Var5 + 0x28))(pp_Var5,local_3c0,local_3b8,&local_3d8);
        }
      }
    }
    else {
      bVar2 = std::operator==(in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
      if ((!bVar2) || (0xffff < local_348)) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Invalid magic value in PPM file");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      for (local_3e8 = 0; local_3e8 < local_344; local_3e8 = local_3e8 + 1) {
        for (local_3f0 = 0; local_3f0 < local_340; local_3f0 = local_3f0 + 1) {
          std::istream::read((char *)local_308,(long)&local_3de);
          pp_Var5 = (in_RDI->super_RefCount)._vptr_RefCount;
          local_84 = (float)local_3de * local_34c;
          local_88 = (float)local_3dc * local_34c;
          local_8c = (float)local_3da * local_34c;
          local_80 = &local_408;
          local_90 = 0x3f800000;
          local_4c = 0x3f800000;
          local_68 = CONCAT44(local_88,local_84);
          uStack_60 = CONCAT44(0x3f800000,local_8c);
          uStack_3fc = 0x3f800000;
          local_58 = local_84;
          local_54 = local_88;
          local_50 = local_8c;
          local_408 = local_84;
          fStack_404 = local_88;
          fStack_400 = local_8c;
          (**(code **)(*pp_Var5 + 0x28))(pp_Var5,local_3f0,local_3e8,&local_408);
        }
      }
    }
  }
  local_34d = 1;
  std::__cxx11::string::~string(local_338);
  std::fstream::~fstream(local_308);
  return (Ref<embree::Image>)in_RDI;
}

Assistant:

Ref<Image> loadPPM(const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::in | std::fstream::binary);

    /* read file type */
    char cty[2]; file.read(cty,2);
    skipSpacesAndComments(file);
    std::string type(cty,2);

    /* read width, height, and maximum color value */
    int width; file >> width;
    skipSpacesAndComments(file);
    int height; file >> height;
    skipSpacesAndComments(file);
    int maxColor; file >> maxColor;
    if (maxColor <= 0) THROW_RUNTIME_ERROR("Invalid maxColor value in PPM file");
    float rcpMaxColor = 1.0f/float(maxColor);
    file.ignore(); // skip space or return

    /* create image and fill with data */
    Ref<Image> img = new Image4uc(width,height,fileName);

    /* image in text format */
    if (type == "P3")
    {
      int r, g, b;
      for (ssize_t y=0; y<height; y++) {
        for (ssize_t x=0; x<width; x++) {
          file >> r; file >> g; file >> b;
          img->set(x,y,Color4(float(r)*rcpMaxColor,float(g)*rcpMaxColor,float(b)*rcpMaxColor,1.0f));
        }
      }
    }

    /* image in binary format 8 bit */
    else if (type == "P6" && maxColor <= 255)
    {
      unsigned char rgb[3];
      for (ssize_t y=0; y<height; y++) {
        for (ssize_t x=0; x<width; x++) {
          file.read((char*)rgb,sizeof(rgb));
          img->set(x,y,Color4(float(rgb[0])*rcpMaxColor,float(rgb[1])*rcpMaxColor,float(rgb[2])*rcpMaxColor,1.0f));
        }
      }
    }

    /* image in binary format 16 bit */
    else if (type == "P6" && maxColor <= 65535)
    {
      unsigned short rgb[3];
      for (ssize_t y=0; y<height; y++) {
        for (ssize_t x=0; x<width; x++) {
          file.read((char*)rgb,sizeof(rgb));
          img->set(x,y,Color4(float(rgb[0])*rcpMaxColor,float(rgb[1])*rcpMaxColor,float(rgb[2])*rcpMaxColor,1.0f));
        }
      }
    }

    /* invalid magic value */
    else {
      THROW_RUNTIME_ERROR("Invalid magic value in PPM file");
    }
    return img;
  }